

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6cb367::TplModelTest_InitTplStats1_Test::TestBody
          (TplModelTest_InitTplStats1_Test *this)

{
  bool bVar1;
  void *pvVar2;
  type file;
  pointer pTVar3;
  AssertionResult gtest_ar_3;
  int i_1;
  AssertionResult gtest_ar_2;
  int i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  unique_ptr<TplParams,_std::default_delete<TplParams>_> tpl_data;
  pointer in_stack_fffffffffffffec8;
  unique_ptr<TplParams,_std::default_delete<TplParams>_> *in_stack_fffffffffffffed0;
  unique_ptr<TplParams,_std::default_delete<TplParams>_> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  uint8_t in_stack_fffffffffffffee7;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  AssertHelper *this_00;
  AssertionResult local_d0;
  int local_bc;
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_a0;
  int local_8c;
  undefined8 local_78;
  undefined8 local_70;
  AssertionResult local_68;
  uint local_54;
  undefined8 local_30;
  AssertionResult local_28;
  undefined1 local_11;
  AssertHelper local_10 [2];
  
  pvVar2 = operator_new(0x50b8,(nothrow_t *)&std::nothrow);
  local_11 = pvVar2 != (void *)0x0;
  this_00 = local_10;
  std::unique_ptr<TplParams,std::default_delete<TplParams>>::
  unique_ptr<std::default_delete<TplParams>,void>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_30 = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<TplParams,std::default_delete<TplParams>>,decltype(nullptr)>
            (in_stack_fffffffffffffee8,
             (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,(void **)in_stack_fffffffffffffed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffef8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x68d989);
    testing::internal::AssertHelper::AssertHelper
              (this_00,(Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x68d9e6);
  }
  local_54 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x68da6d);
  if (local_54 == 0) {
    file = std::unique_ptr<TplParams,_std::default_delete<TplParams>_>::operator*
                     (in_stack_fffffffffffffed0);
    memset(file,0,0x50b8);
    pTVar3 = std::unique_ptr<TplParams,_std::default_delete<TplParams>_>::operator->
                       ((unique_ptr<TplParams,_std::default_delete<TplParams>_> *)0x68dab0);
    pTVar3->ready = 1;
    local_70 = 0x2760;
    local_78 = 0x2760;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffee8,
               (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (unsigned_long *)in_stack_fffffffffffffed8,(unsigned_long *)in_stack_fffffffffffffed0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffee8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x68db41);
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)file,
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
      testing::Message::~Message((Message *)0x68db9e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x68dc0c);
    for (local_8c = 0; local_8c < 0x69; local_8c = local_8c + 1) {
      in_stack_fffffffffffffee7 = (char)local_8c + '\x01';
      pTVar3 = std::unique_ptr<TplParams,_std::default_delete<TplParams>_>::operator->
                         ((unique_ptr<TplParams,_std::default_delete<TplParams>_> *)0x68dc3c);
      pTVar3->tpl_stats_buffer[local_8c].is_valid = in_stack_fffffffffffffee7;
    }
    std::unique_ptr<TplParams,_std::default_delete<TplParams>_>::get(in_stack_fffffffffffffed0);
    av1_init_tpl_stats((TplParams *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::unique_ptr<TplParams,_std::default_delete<TplParams>_>::operator->
              ((unique_ptr<TplParams,_std::default_delete<TplParams>_> *)0x68dc9e);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffee8,
               (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (int *)in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffed8 =
           (unique_ptr<TplParams,_std::default_delete<TplParams>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x68dd05);
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)file,
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
      testing::Message::~Message((Message *)0x68dd62);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x68ddd0);
    for (local_bc = 0; local_bc < 0x69; local_bc = local_bc + 1) {
      std::unique_ptr<TplParams,_std::default_delete<TplParams>_>::operator->
                ((unique_ptr<TplParams,_std::default_delete<TplParams>_> *)0x68ddf0);
      testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
                (in_stack_fffffffffffffee8,
                 (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (uchar *)in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
      if (!bVar1) {
        testing::Message::Message((Message *)this_00);
        in_stack_fffffffffffffed0 =
             (unique_ptr<TplParams,_std::default_delete<TplParams>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x68de66);
        testing::internal::AssertHelper::AssertHelper
                  (this_00,(Type)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)file,
                   (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
        testing::Message::~Message((Message *)0x68deb4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x68df16);
    }
    local_54 = 0;
  }
  std::unique_ptr<TplParams,_std::default_delete<TplParams>_>::~unique_ptr
            (in_stack_fffffffffffffed0);
  return;
}

Assistant:

TEST(TplModelTest, InitTplStats1) {
  // We use heap allocation instead of stack allocation here to avoid
  // -Wstack-usage warning.
  std::unique_ptr<TplParams> tpl_data(new (std::nothrow) TplParams);
  ASSERT_NE(tpl_data, nullptr);
  av1_zero(*tpl_data);
  tpl_data->ready = 1;
  EXPECT_EQ(sizeof(tpl_data->tpl_stats_buffer),
            MAX_LENGTH_TPL_FRAME_STATS * sizeof(tpl_data->tpl_stats_buffer[0]));
  for (int i = 0; i < MAX_LENGTH_TPL_FRAME_STATS; ++i) {
    // Set it to a random non-zero number
    tpl_data->tpl_stats_buffer[i].is_valid = i + 1;
  }
  av1_init_tpl_stats(tpl_data.get());
  EXPECT_EQ(tpl_data->ready, 0);
  for (int i = 0; i < MAX_LENGTH_TPL_FRAME_STATS; ++i) {
    EXPECT_EQ(tpl_data->tpl_stats_buffer[i].is_valid, 0);
  }
}